

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall
cppcms::widgets::select_multiple::add(select_multiple *this,string *opt,bool selected)

{
  string id;
  string local_108;
  element local_e8;
  
  impl::todec_string<unsigned_long>
            (&local_108,
             ((long)(this->elements_).
                    super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->elements_).
                    super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x70a3d70a3d70a3d7);
  element::element(&local_e8,&local_108,opt,selected);
  std::
  vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
  ::emplace_back<cppcms::widgets::select_multiple::element>(&this->elements_,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.tr_option.plural_._M_dataplus._M_p != &local_e8.tr_option.plural_.field_2) {
    operator_delete(local_e8.tr_option.plural_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.tr_option.context_._M_dataplus._M_p != &local_e8.tr_option.context_.field_2) {
    operator_delete(local_e8.tr_option.context_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.tr_option.id_._M_dataplus._M_p != &local_e8.tr_option.id_.field_2) {
    operator_delete(local_e8.tr_option.id_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.str_option._M_dataplus._M_p != &local_e8.str_option.field_2) {
    operator_delete(local_e8.str_option._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.id._M_dataplus._M_p != &local_e8.id.field_2) {
    operator_delete(local_e8.id._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return;
}

Assistant:

void select_multiple::add(std::string const &opt,bool selected)
{
	std::string id=impl::todec_string(elements_.size());
	elements_.push_back(element(id,opt,selected));
}